

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::Configurations::unsafeSetGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  byte in_CL;
  anon_class_32_4_9afad3aa *in_RDI;
  EnumType lIndex;
  _Any_data *fn;
  EnumType *startIndex;
  function<bool_()> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  Configurations *in_stack_ffffffffffffffb0;
  EnumType local_40 [18];
  _Any_data local_1c;
  
  local_1c._M_pod_data[3] = in_CL & 1;
  if (local_1c._M_pod_data[3] != 0) {
    unsafeSet(in_stack_ffffffffffffffb0,(Level)((ulong)in_stack_ffffffffffffffa8 >> 0x30),
              (ConfigurationType)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
              in_stack_ffffffffffffffa0);
  }
  local_1c._0_2_ = 2;
  fn = &local_1c;
  startIndex = local_40;
  std::function<bool()>::
  function<el::Configurations::unsafeSetGlobally(el::ConfigurationType,std::__cxx11::string_const&,bool)::_lambda()_1_,void>
            (in_stack_ffffffffffffff90,in_RDI);
  LevelHelper::forEachLevel(startIndex,(function<bool_()> *)fn);
  std::function<bool_()>::~function((function<bool_()> *)0x1e7445);
  return;
}

Assistant:

void unsafeSetGlobally(ConfigurationType configurationType, const std::string& value, bool includeGlobalLevel) {
    if (includeGlobalLevel) {
      unsafeSet(Level::Global, configurationType, value);
    }
    base::type::EnumType lIndex = LevelHelper::kMinValid;
    LevelHelper::forEachLevel(&lIndex, [&](void) -> bool  {
      unsafeSet(LevelHelper::castFromInt(lIndex), configurationType, value);
      return false;  // Do not break lambda function yet as we need to set all levels regardless
    });
  }